

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::ReservedNamePrefix
                   (string *__return_storage_ptr__,string *classname,FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  string lower;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)classname);
  for (sVar4 = 0; local_48._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    iVar2 = tolower((int)local_48._M_dataplus._M_p[sVar4]);
    local_48._M_dataplus._M_p[sVar4] = (char)iVar2;
  }
  lVar3 = 0;
  do {
    if (lVar3 == 0x248) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_49);
      goto LAB_0029e406;
    }
    bVar1 = std::operator==(&local_48,*(char **)((long)kReservedNames + lVar3));
    lVar3 = lVar3 + 8;
  } while (!bVar1);
  bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (file + 8),"google.protobuf");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"GPB",&local_49);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"PB",&local_49);
  }
LAB_0029e406:
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamePrefix(const string& classname,
                                const FileDescriptor* file) {
  bool is_reserved = false;

  string lower = classname;
  transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (file->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}